

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

bool __thiscall
FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
::hasFastAccess(FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
                *this)

{
  bool bVar1;
  undefined1 local_9;
  
  bVar1 = FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          ::hasFastAccess((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                           *)0x185a7ea);
  local_9 = false;
  if (bVar1) {
    local_9 = FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
              ::hasFastAccess((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                               *)0x185a806);
  }
  return local_9;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}